

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void on_request(http_s *request)

{
  int *piVar1;
  ulong uVar2;
  FIOBJ FVar3;
  int iVar4;
  size_t sVar5;
  lua_State *L;
  char *pcVar6;
  char *__s;
  FIOBJ FVar7;
  fiobj_object_vtable_s *pfVar8;
  uint uVar9;
  char cVar10;
  size_t error;
  fio_str_info_s ret;
  char luaPath [256];
  stat path_stat;
  fio_str_info_s local_1d8;
  char local_1b8 [8];
  char acStack_1b0 [256];
  stat local_b0;
  
  llog_trace("Check path");
  uVar2 = request->path;
  if (uVar2 == 0) {
LAB_0010e45c:
    local_1d8.data = anon_var_dwarf_20c;
    local_1d8.len._0_4_ = 4;
    goto LAB_0010e46f;
  }
  cVar10 = (char)uVar2;
  if ((uVar2 & 1) != 0) {
    fio_ltocstr(&local_1d8,(long)uVar2 >> 1);
    goto LAB_0010e473;
  }
  switch((uint)uVar2 & 6) {
  case 0:
    cVar10 = *(char *)(uVar2 & 0xfffffffffffffff8);
LAB_0010e3f1:
    switch(cVar10) {
    case '\'':
      pfVar8 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      goto switchD_0010e3e6_caseD_2;
    case ')':
      pfVar8 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      goto switchD_0010e3e6_caseD_4;
    case '+':
      pfVar8 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar8 = &FIOBJECT_VTABLE_NUMBER;
    }
    break;
  case 2:
switchD_0010e3e6_caseD_2:
    pfVar8 = &FIOBJECT_VTABLE_STRING;
    break;
  case 4:
switchD_0010e3e6_caseD_4:
    pfVar8 = &FIOBJECT_VTABLE_HASH;
    break;
  case 6:
    if (cVar10 == '&') {
      local_1d8.data = anon_var_dwarf_217;
      local_1d8.len._0_4_ = 5;
    }
    else {
      uVar9 = (uint)uVar2 & 0xff;
      if (uVar9 != 0x16) {
        if (uVar9 == 6) goto LAB_0010e45c;
        goto LAB_0010e3f1;
      }
      local_1d8.data = anon_var_dwarf_222;
      local_1d8.len._0_4_ = 4;
    }
LAB_0010e46f:
    local_1d8.capa._0_4_ = 0;
    local_1d8.capa._4_4_ = 0;
    local_1d8.len._4_4_ = 0;
    goto LAB_0010e473;
  }
  (*pfVar8->to_str)(&local_1d8,uVar2);
LAB_0010e473:
  pcVar6 = local_1d8.data;
  sVar5 = strlen(local_1d8.data);
  if (sVar5 < 0x100) {
    memset(local_1b8,0,0x100);
    if ((*pcVar6 == '/') && (pcVar6[1] == '\0')) {
      local_1b8[0] = 'p';
      local_1b8[1] = 'a';
      local_1b8[2] = 'g';
      local_1b8[3] = 'e';
      local_1b8[4] = 's';
      local_1b8[5] = '/';
      local_1b8[6] = 'i';
      local_1b8[7] = 'n';
      acStack_1b0[0] = 'd';
      acStack_1b0[1] = 'e';
      acStack_1b0[2] = 'x';
      acStack_1b0[3] = '.';
      acStack_1b0[4] = 'l';
      acStack_1b0[5] = 'u';
      acStack_1b0[6] = 'a';
      acStack_1b0[7] = '\0';
    }
    else {
      snprintf(local_1b8,0x100,"%s%s%s");
    }
    llog_trace(local_1b8);
    llog_trace("Check exists");
    iVar4 = access(local_1b8,0);
    if ((iVar4 != -1) && (stat(local_1b8,&local_b0), (local_b0.st_mode & 0xf000) == 0x8000)) {
      llog_trace("Init Lua");
      L = luaL_newstate();
      luaL_openlibs(L);
      llog_trace("Run file");
      iVar4 = luaL_loadfilex(L,local_1b8,(char *)0x0);
      if (iVar4 == 0) {
        lua_pcallk(L,0,-1,0,0,(lua_KFunction)0x0);
      }
      llog_trace("Run func");
      lua_getglobal(L,"doPage");
      lua_callk(L,0,2,0,(lua_KFunction)0x0);
      llog_trace("Parse returns");
      pcVar6 = lua_tolstring(L,-1,(size_t *)0x0);
      __s = lua_tolstring(L,-2,(size_t *)0x0);
      lua_settop(L,-3);
      llog_trace("Cleanup Lua");
      lua_close(L);
      llog_trace("Return results");
      FVar3 = HTTP_HEADER_CONTENT_TYPE;
      sVar5 = strlen(pcVar6);
      FVar7 = http_mimetype_find(pcVar6,sVar5);
      http_set_header(request,FVar3,FVar7);
      FVar7 = HTTP_HEADER_SERVER_VALUE;
      FVar3 = HTTP_HEADER_SERVER;
      if ((((~(uint)HTTP_HEADER_SERVER_VALUE & 6) != 0) && (HTTP_HEADER_SERVER_VALUE != 0)) &&
         ((HTTP_HEADER_SERVER_VALUE & 1) == 0)) {
        LOCK();
        piVar1 = (int *)((HTTP_HEADER_SERVER_VALUE & 0xfffffffffffffff8) + 4);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      http_set_header(request,FVar3,FVar7);
      sVar5 = strlen(__s);
      http_send_body(request,__s,sVar5);
      return;
    }
    error = 0x194;
  }
  else {
    error = 500;
  }
  http_send_error(request,error);
  return;
}

Assistant:

void on_request(http_s *request) {
    // Generate the path to the Lua file to handle our request
    llog_trace("Check path");
    // TODO: sanatise path (make sure it doesn't escape the pages folder, etc)
    char* path = fiobj_obj2cstr(request->path).data;
    // The actual max path is MAX_LENGTH-1 (ex. 256-1), since it needs to be null terminated
    // TODO: take into account "pages" and ".lua"
    if(strlen(path) > PATH_MAX_LEN - 1) {
        http_send_error(request, 500);
        return;
    }
    char luaPath[PATH_MAX_LEN];
    memset(luaPath, 0, sizeof(luaPath));
    if (strcmp(path, "/") == 0) {
        // sizeof is useful here because we do want to include the null
        // character in the length
        snprintf(luaPath, sizeof(luaPath), "pages/index.lua");
    } else {
        // Combine "pages", path, and ".lua" to create our target path
        // The path variable should always start with a /
        snprintf(luaPath, sizeof(luaPath), "%s%s%s", "pages", path, ".lua");
    }
    llog_trace(luaPath);

    // Check if the Lua file does not exist
    llog_trace("Check exists");
    if (access(luaPath, F_OK) == -1) {
        http_send_error(request, 404);
        return;
    }

     // Check if it's actually a file, not a folder
    struct stat path_stat;
    stat(luaPath, &path_stat);
    if (!S_ISREG(path_stat.st_mode)) {
        http_send_error(request, 404);
        return;
    }

    // Initialise a Lua interpreter
    llog_trace("Init Lua");
    lua_State* L = luaL_newstate();
    luaL_openlibs(L);

    // Import the file
    llog_trace("Run file");
    luaL_dofile(L, luaPath);

    // Run the doPage() function
    llog_trace("Run func");
    lua_getglobal(L, "doPage");
    lua_call(L, 0, 2);

    // Get the returning strings
    llog_trace("Parse returns");
    char* mime = (char*)lua_tostring(L, -1);
    char* result = (char*)lua_tostring(L, -2);
    lua_pop(L, 2);

    // Close the Lua interpreter session
    llog_trace("Cleanup Lua");
    lua_close(L);

    // Send result to client
    llog_trace("Return results");
    http_set_header(request, HTTP_HEADER_CONTENT_TYPE, http_mimetype_find(mime, strlen(mime)));
    // TODO: not run fiobj_str_new every request for a static header
    http_set_header(
        request, 
        HTTP_HEADER_SERVER, 
        fiobj_dup(HTTP_HEADER_SERVER_VALUE)
    );
    http_send_body(request, result, strlen(result));
}